

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O3

void __thiscall crnlib::dxt_hc::determine_tiles_task_etc(dxt_hc *this,uint64 data,void *param_2)

{
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar1;
  undefined8 *puVar2;
  float *pfVar3;
  float fVar4;
  uint uVar5;
  color_quad_u8 (*pacVar6) [16];
  double dVar7;
  uint uVar8;
  ulong uVar9;
  byte *pbVar10;
  bool bVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  tile_details *this_00;
  ulong uVar15;
  ulong uVar16;
  byte *pbVar17;
  byte bVar18;
  ulong uVar19;
  float (*pafVar20) [8];
  uint *puVar21;
  uchar uVar22;
  uint t;
  uint e;
  long lVar23;
  bool bVar24;
  float fVar25;
  vec2F alpha_endpoints;
  int scan [3];
  uint total_error [3];
  int refine [4];
  results results;
  color_quad_u8 tilePixels [32];
  uint tile_error [5];
  etc1_optimizer optimizer;
  uint8 selectors [32];
  undefined1 local_2d8 [8];
  uint local_2d0;
  undefined2 local_2cc;
  float local_2c8;
  color_quad<unsigned_char,_int> *local_2c0;
  undefined1 local_2b8;
  float *local_2b0;
  float local_2a8;
  float fStack_2a4;
  undefined1 local_2a0;
  ulong local_298;
  long local_290;
  ulong local_288;
  ulong local_280;
  long local_278;
  float local_270 [3];
  uint auStack_264 [3];
  tile_details *local_258;
  float afStack_250 [2];
  undefined1 local_248 [16];
  ulong local_238;
  float local_228;
  undefined1 *local_220;
  vec6F local_210;
  color_quad<unsigned_char,_int> local_1f8 [2];
  float afStack_1f0 [2];
  float local_1e8 [8];
  float local_1c8 [8];
  float local_1a8 [8];
  float local_188 [8];
  etc1_optimizer local_158;
  undefined1 local_58 [40];
  
  local_158.m_best_solution.m_selectors.m_p = (uchar *)0x0;
  local_158.m_best_solution.m_selectors.m_size = 0;
  local_158.m_best_solution.m_selectors.m_capacity = 0;
  local_158.m_luma.m_p = (unsigned_short *)0x0;
  local_158.m_luma.m_size = 0;
  local_158.m_luma.m_capacity = 0;
  local_158.m_sorted_luma[0].m_p = (uint *)0x0;
  local_158.m_sorted_luma[0].m_size = 0;
  local_158.m_sorted_luma[0].m_capacity = 0;
  local_158.m_sorted_luma[1].m_p = (uint *)0x0;
  local_158.m_sorted_luma[1].m_size = 0;
  local_158.m_sorted_luma[1].m_capacity = 0;
  local_158.m_selectors.m_p = (uchar *)0x0;
  local_158.m_selectors.m_size = 0;
  local_158.m_selectors.m_capacity = 0;
  local_158.m_best_selectors.m_p = (uchar *)0x0;
  local_158.m_best_selectors.m_size._0_1_ = 0;
  local_158.m_best_selectors._9_7_ = 0;
  local_158.m_best_solution.m_coords.m_unscaled_color.field_0.field_0.r = '\0';
  local_158.m_best_solution.m_coords._1_8_ = 0;
  local_158.m_best_solution.m_error = 0xffffffffffffffff;
  local_158.m_best_solution.m_valid = false;
  local_158.m_trial_solution.m_coords.m_unscaled_color.field_0 =
       (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
  local_158.m_trial_solution.m_coords.m_inten_table = 0;
  local_158.m_trial_solution.m_coords.m_color4 = false;
  local_158.m_trial_solution.m_selectors.m_p = (uchar *)0x0;
  local_158.m_trial_solution.m_selectors.m_size = 0;
  local_158.m_trial_solution.m_selectors.m_capacity = 0;
  local_158.m_trial_solution.m_error = 0xffffffffffffffff;
  local_158.m_trial_solution.m_valid = false;
  local_158.m_temp_selectors.m_p = (uchar *)0x0;
  local_158.m_temp_selectors.m_size = 0;
  local_158.m_temp_selectors.m_capacity = 0;
  local_158.m_pParams = (params *)0x0;
  local_158.m_pResult = (results *)0x0;
  local_158.m_pSorted_luma_indices = (uint32 *)0x0;
  local_158.m_pSorted_luma = (uint32 *)0x0;
  local_2d0 = 2;
  local_2cc = 1;
  local_2c8 = 0.0;
  local_2c0 = (color_quad<unsigned_char,_int> *)0x0;
  local_2b0 = (float *)&etc1_optimizer::params::clear_optimizer_params()::s_default_scan_delta;
  local_2a8 = 1.4013e-45;
  fStack_2a4 = 0.0;
  local_2b8 = 0;
  local_2a0 = 0;
  local_220 = local_58;
  local_270[0] = -NAN;
  local_270[1] = 0.0;
  local_270[2] = 1.4013e-45;
  local_248._0_4_ = -NAN;
  local_248._4_4_ = -NAN;
  local_248._8_4_ = 2.8026e-45;
  local_248._12_4_ = 4.2039e-45;
  uVar8 = (this->m_params).m_num_levels;
  uVar15 = (ulong)uVar8;
  if (uVar8 != 0) {
    uVar9 = (ulong)(this->m_pTask_pool->m_num_threads + 1);
    local_290 = data + 1;
    pafVar20 = this->m_color_derating;
    uVar19 = 0;
    do {
      uVar5 = (this->m_params).m_levels[uVar19].m_first_block;
      uVar12 = (ulong)(this->m_params).m_levels[uVar19].m_num_blocks;
      uVar13 = (int)((uVar12 * data) / uVar9) + uVar5 & 0xfffffffe;
      uVar14 = (ulong)uVar13;
      uVar8 = (int)((uVar12 * local_290) / uVar9) + uVar5 & 0xfffffffe;
      if (uVar13 < uVar8) {
        fVar4 = (this->m_params).m_levels[uVar19].m_weight;
        local_280 = (ulong)uVar8;
        local_298 = uVar19;
        do {
          pacVar6 = this->m_blocks;
          uVar19 = uVar14 >> 1;
          uVar8 = 0;
          local_278 = uVar19 * 0x40;
          uVar15 = 0;
          do {
            uVar13 = (uint)(uVar15 >> 2) & 0x3fffffff | uVar8 & 0xc;
            local_1f8[uVar15].field_0.field_0.r = pacVar6[uVar19][uVar13].field_0.field_0.r;
            local_1f8[uVar15].field_0.field_0.g = pacVar6[uVar19][uVar13].field_0.field_0.g;
            local_1f8[uVar15].field_0.field_0.b = pacVar6[uVar19][uVar13].field_0.field_0.b;
            local_1f8[uVar15].field_0.field_0.a = pacVar6[uVar19][uVar13].field_0.field_0.a;
            uVar15 = uVar15 + 1;
            uVar8 = uVar8 + 4;
          } while (uVar15 != 0x10);
          local_1c8._16_8_ = *(undefined8 *)pacVar6[uVar19];
          local_1c8._24_8_ = *(undefined8 *)(pacVar6[uVar19] + 2);
          local_1a8._0_8_ = *(undefined8 *)(pacVar6[uVar19] + 4);
          local_1a8._8_8_ = *(undefined8 *)(pacVar6[uVar19] + 4 + 2);
          paVar1 = &pacVar6[uVar19][8].field_0;
          local_1a8[4] = *(float *)paVar1;
          local_1a8[5] = *(float *)(paVar1 + 1);
          local_1a8[6] = *(float *)(paVar1 + 2);
          local_1a8[7] = *(float *)(paVar1 + 3);
          local_188._0_8_ = *(undefined8 *)(pacVar6[uVar19] + 0xc);
          local_188._8_8_ = *(undefined8 *)(pacVar6[uVar19] + 0xc + 2);
          puVar21 = &DAT_001b0850;
          uVar15 = 0;
          do {
            local_2c8 = (float)(8 << ((byte)(uVar15 >> 2) & 0x1f));
            local_2c0 = local_1f8 + *puVar21;
            local_228 = local_2c8;
            etc1_optimizer::init(&local_158,(EVP_PKEY_CTX *)&local_2d0);
            local_2b0 = local_270;
            local_2a8 = 4.2039e-45;
            etc1_optimizer::compute(&local_158);
            if ((uint)((int)local_2c8 * 0x177) < local_238) {
              local_2b0 = (float *)local_248;
              local_2a8 = 5.60519e-45;
              etc1_optimizer::compute(&local_158);
            }
            local_188[uVar15 + 4] = (float)local_238;
            uVar15 = uVar15 + 1;
            puVar21 = puVar21 + 1;
          } while (uVar15 != 5);
          pbVar10 = &DAT_001b0864;
          uVar15 = 0;
          do {
            uVar12 = uVar15 + 1;
            uVar8 = 0;
            pbVar17 = pbVar10;
            uVar19 = uVar12 & 0xffffffff;
            do {
              uVar8 = uVar8 + (int)local_188[(ulong)*pbVar17 + 4];
              pbVar17 = pbVar17 + 1;
              bVar18 = (byte)uVar19;
              uVar19 = uVar19 >> 1 & 0x7f;
            } while (1 < bVar18);
            auStack_264[uVar15] = uVar8;
            pbVar10 = pbVar10 + 2;
            uVar15 = uVar12;
          } while (uVar12 != 3);
          fVar25 = 0.0;
          uVar19 = 0;
          uVar15 = 0;
          do {
            dVar7 = 999999.0;
            if (auStack_264[uVar19] != 0) {
              dVar7 = log10(255.0 / SQRT((double)auStack_264[uVar19] / 48.0));
              dVar7 = dVar7 * 20.0;
            }
            dVar7 = dVar7 - (double)(*pafVar20)[uVar19];
            if (dVar7 <= 0.0) {
              dVar7 = 0.0;
            }
            if (fVar25 < (float)dVar7) {
              uVar15 = uVar19 & 0xffffffff;
              fVar25 = (float)dVar7;
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != 3);
          if (this->m_num_alpha_blocks == 0) {
            local_2d8 = (undefined1  [8])0x0;
          }
          else {
            palettize_alpha((dxt_hc *)local_2d8,(color_quad_u8 *)this,(uint)local_1f8,0x10);
          }
          uVar8 = (uint)uVar15 + 1;
          uVar19 = 0xffffffff;
          if (uVar8 != 0) {
            local_258 = (tile_details *)local_2d8;
            afStack_250[0] = 0.0;
            afStack_250[1] = 0.0;
            lVar23 = 0;
            local_288 = uVar15;
            do {
              this_00 = (this->m_tiles).m_p + ((uint)lVar23 | (uint)uVar14);
              vector<crnlib::color_quad<unsigned_char,_int>_>::append
                        (&this_00->pixels,
                         local_1f8 +
                         (uint)(&DAT_001b0850)[(byte)(&DAT_001b0864)[uVar15 * 2 + lVar23]],
                         8 << ((byte)(&DAT_001b0864)[uVar15 * 2 + lVar23] >> 2 & 0x1f));
              this_00->weight = fVar4;
              palettize_color(&local_210,this,(this_00->pixels).m_p,(this_00->pixels).m_size);
              *(undefined8 *)((this_00->color_endpoint).m_s + 4) = local_210.m_s._16_8_;
              *(undefined8 *)(this_00->color_endpoint).m_s = local_210.m_s._0_8_;
              *(undefined8 *)((this_00->color_endpoint).m_s + 2) = local_210.m_s._8_8_;
              if (this->m_num_alpha_blocks != 0) {
                *(tile_details **)((vec<2U,_float> *)(&this_00->color_endpoint + 1))->m_s =
                     local_258;
              }
              lVar23 = lVar23 + 1;
              bVar24 = 1 < uVar8;
              uVar19 = local_288;
              uVar8 = uVar8 >> 1;
            } while (bVar24);
          }
          uVar12 = 0;
          bVar24 = true;
          do {
            bVar11 = bVar24;
            uVar16 = uVar12 | uVar14;
            uVar22 = (uchar)uVar15;
            (this->m_block_encodings).m_p[uVar16] = uVar22;
            lVar23 = uVar12 + uVar19 * 2;
            uVar12 = 1;
            if (bVar11) {
              uVar22 = '\0';
            }
            (this->m_tile_indices).m_p[uVar16] = (uint)(byte)(&DAT_001b086a)[lVar23] | (uint)uVar14;
            (this->m_endpoint_indices).m_p[uVar16].reference = uVar22;
            bVar24 = false;
          } while (bVar11);
          if (1 < (uint)uVar15) {
            pacVar6 = this->m_blocks;
            puVar2 = (undefined8 *)((long)&(*pacVar6)[0xc].field_0 + local_278);
            *puVar2 = local_1c8._0_8_;
            puVar2[1] = local_1c8._8_8_;
            pfVar3 = (float *)((long)&(*pacVar6)[8].field_0 + local_278);
            *(undefined8 *)pfVar3 = local_1e8._16_8_;
            *(undefined8 *)(pfVar3 + 2) = local_1e8._24_8_;
            puVar2 = (undefined8 *)((long)&(*pacVar6)[4].field_0 + local_278);
            *puVar2 = local_1e8._0_8_;
            puVar2[1] = local_1e8._8_8_;
            pfVar3 = (float *)((long)&(*pacVar6)[0].field_0 + local_278);
            *(color_quad<unsigned_char,_int> (*) [2])pfVar3 = local_1f8;
            *(float (*) [2])(pfVar3 + 2) = afStack_1f0;
          }
          uVar14 = uVar14 + 2;
        } while (uVar14 < local_280);
        uVar15 = (ulong)(this->m_params).m_num_levels;
        uVar19 = local_298;
      }
      uVar19 = uVar19 + 1;
      pafVar20 = pafVar20 + 1;
    } while (uVar19 < uVar15);
  }
  etc1_optimizer::~etc1_optimizer(&local_158);
  return;
}

Assistant:

void dxt_hc::determine_tiles_task_etc(uint64 data, void*)
    {
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        uint offsets[5] = { 0, 8, 16, 24, 16 };
        uint8 tiles[3][2] = { { 4 }, { 2, 3 }, { 0, 1 } };
        uint8 tile_map[3][2] = { { 0, 0 }, { 0, 1 }, { 0, 1 } };
        color_quad_u8 tilePixels[32];
        uint8 selectors[32];
        uint tile_error[5];
        uint total_error[3];

        etc1_optimizer optimizer;
        etc1_optimizer::params params;
        params.m_use_color4 = false;
        params.m_constrain_against_base_color5 = false;
        etc1_optimizer::results results;
        results.m_pSelectors = selectors;
        int scan[] = { -1, 0, 1 };
        int refine[] = { -3, -2, 2, 3 };

        for (uint level = 0; level < m_params.m_num_levels; level++)
        {
            float weight = m_params.m_levels[level].m_weight;
            uint b = (m_params.m_levels[level].m_first_block + m_params.m_levels[level].m_num_blocks * data / num_tasks) & ~1;
            uint bEnd = (m_params.m_levels[level].m_first_block + m_params.m_levels[level].m_num_blocks * (data + 1) / num_tasks) & ~1;
            for (; b < bEnd; b += 2)
            {
                for (uint p = 0; p < 16; p++)
                {
                    tilePixels[p] = m_blocks[b >> 1][(p << 2 & 12) | p >> 2];
                }
                memcpy(tilePixels + 16, m_blocks[b >> 1], 64);
                for (uint t = 0; t < 5; t++)
                {
                    params.m_pSrc_pixels = tilePixels + offsets[t];
                    params.m_num_src_pixels = results.m_n = 8 << (t >> 2);
                    optimizer.init(params, results);
                    params.m_pScan_deltas = scan;
                    params.m_scan_delta_size = sizeof(scan) / sizeof(*scan);
                    optimizer.compute();
                    if (results.m_error > 375 * params.m_num_src_pixels)
                    {
                        params.m_pScan_deltas = refine;
                        params.m_scan_delta_size = sizeof(refine) / sizeof(*refine);
                        optimizer.compute();
                    }
                    tile_error[t] = results.m_error;
                }

                for (uint8 e = 0; e < 3; e++)
                {
                    total_error[e] = 0;
                    for (uint8 t = 0, s = e + 1; s; s >>= 1, t++)
                    {
                        total_error[e] += tile_error[tiles[e][t]];
                    }
                }

                float best_quality = 0.0f;
                uint best_encoding = 0;
                for (uint e = 0; e < 3; e++)
                {
                    float quality = 0;
                    double peakSNR = total_error[e] ? log10(255.0f / sqrt(total_error[e] / 48.0)) * 20.0f : 999999.0f;
                    quality = (float)math::maximum<double>(peakSNR - m_color_derating[level][e], 0.0f);
                    if (quality > best_quality)
                    {
                        best_quality = quality;
                        best_encoding = e;
                    }
                }

                vec2F alpha_endpoints = m_num_alpha_blocks ? palettize_alpha(tilePixels, 16, 3) : vec2F(cClear);
                for (uint tile_index = 0, s = best_encoding + 1; s; s >>= 1, tile_index++)
                {
                    tile_details& tile = m_tiles[b | tile_index];
                    uint t = tiles[best_encoding][tile_index];
                    tile.pixels.append(tilePixels + offsets[t], 8 << (t >> 2));
                    tile.weight = weight;
                    tile.color_endpoint = palettize_color(tile.pixels.get_ptr(), tile.pixels.size());
                    if (m_num_alpha_blocks)
                    {
                        tile.alpha_endpoints[0] = alpha_endpoints;
                    }
                }

                for (uint bx = 0; bx < 2; bx++)
                {
                    m_block_encodings[b | bx] = best_encoding;
                    m_tile_indices[b | bx] = b | tile_map[best_encoding][bx];
                    m_endpoint_indices[b | bx].reference = bx ? best_encoding : 0;
                }
                if (best_encoding >> 1)
                {
                    memcpy(m_blocks[b >> 1], tilePixels, 64);
                }
            }
        }
    }